

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VCloneEmptyVectorArray(int count,N_Vector W,int myid)

{
  int iVar1;
  long lVar2;
  uint in_EDX;
  N_Vector in_RSI;
  uint in_EDI;
  double dVar3;
  double dVar4;
  N_Vector *vs;
  double maxt;
  double stop_time;
  double start_time;
  int i;
  uint local_18;
  int local_4;
  
  dVar3 = get_time();
  lVar2 = N_VCloneEmptyVectorArray(in_EDI,in_RSI);
  dVar4 = get_time();
  if (((int)in_EDI < 1) && (lVar2 != 0)) {
    printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n",(ulong)in_EDX);
    printf("    count = %d, expected *vs = NULL \n\n",(ulong)in_EDI);
    local_4 = 1;
  }
  else {
    for (local_18 = 0; (int)local_18 < (int)in_EDI; local_18 = local_18 + 1) {
      if (*(long *)(lVar2 + (long)(int)local_18 * 8) == 0) {
        printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n",(ulong)in_EDX);
        printf("    Vector[%d] = NULL \n\n",(ulong)local_18);
        N_VDestroyVectorArray(lVar2,in_EDI);
        return 1;
      }
      iVar1 = has_data(*(N_Vector *)(lVar2 + (long)(int)local_18 * 8));
      if (iVar1 != 0) {
        printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n",(ulong)in_EDX);
        printf("    Vector[%d] data != NULL \n\n",(ulong)local_18);
        N_VDestroyVectorArray(lVar2,in_EDI);
        return 1;
      }
    }
    N_VDestroyVectorArray(lVar2,in_EDI);
    if (in_EDX == 0) {
      printf("PASSED test -- N_VCloneEmptyVectorArray \n");
    }
    dVar3 = max_time(in_RSI,dVar4 - dVar3);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",dVar3,"N_VCloneEmptyVectorArray");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Test_N_VCloneEmptyVectorArray(int count, N_Vector W, int myid)
{
  int i;
  double start_time, stop_time, maxt;
  N_Vector* vs;

  /* clone empty array */
  start_time = get_time();
  vs         = N_VCloneEmptyVectorArray(count, W);
  stop_time  = get_time();

  /* check array of vectors */
  if (count <= 0 && vs != NULL)
  {
    printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n", myid);
    printf("    count = %d, expected *vs = NULL \n\n", count);
    return (1);
  }

  /* check vectors in array */
  for (i = 0; i < count; i++)
  {
    if (vs[i] == NULL)
    {
      printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n", myid);
      printf("    Vector[%d] = NULL \n\n", i);
      N_VDestroyVectorArray(vs, count);
      return (1);
    }

    if (has_data(vs[i]))
    {
      printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n", myid);
      printf("    Vector[%d] data != NULL \n\n", i);
      N_VDestroyVectorArray(vs, count);
      return (1);
    }
  }

  N_VDestroyVectorArray(vs, count);

  if (myid == 0) { printf("PASSED test -- N_VCloneEmptyVectorArray \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VCloneEmptyVectorArray", maxt);

  return (0);
}